

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *this,int value)

{
  type pcVar1;
  char *pcVar2;
  char *local_30;
  char **local_28;
  type *it;
  uint num_digits;
  int iStack_14;
  bool is_negative;
  main_type abs_value;
  int value_local;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_local;
  
  num_digits = value;
  iStack_14 = value;
  _abs_value = this;
  it._7_1_ = internal::is_negative<int>(value);
  if ((bool)it._7_1_) {
    num_digits = -num_digits;
  }
  it._0_4_ = internal::count_digits(num_digits);
  pcVar1 = reserve(this,(ulong)(((it._7_1_ & 1) != 0) + (uint)it));
  local_28 = &local_30;
  local_30 = pcVar1;
  if ((it._7_1_ & 1) != 0) {
    local_30 = pcVar1 + 1;
    *pcVar1 = '-';
  }
  pcVar2 = internal::format_decimal<char*,unsigned_int>(local_30,num_digits,(uint)it);
  *local_28 = pcVar2;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    unsigned num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + num_digits);
    if (is_negative)
      *it++ = '-';
    it = internal::format_decimal(it, abs_value, num_digits);
  }